

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O1

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  size_type sVar1;
  cmState *pcVar2;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  __last;
  uint uVar3;
  char *pcVar4;
  byte bVar5;
  _Bool _Var6;
  FIELD *pFVar7;
  long *plVar8;
  cmCursesLongMessageForm *pcVar9;
  char *pcVar10;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  char *__s;
  long *plVar14;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  _Var15;
  FIELD **ppFVar16;
  int iVar17;
  ulong uVar18;
  FORM *pFVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  uint uVar21;
  bool bVar22;
  string searchstr;
  int key;
  char debugMessage [128];
  string local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  uint local_10c;
  allocator<char> local_105;
  uint local_104;
  char *local_100;
  string local_f8;
  FIELD *local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  string *local_c0;
  char local_b8 [136];
  
  if ((this->super_cmCursesForm).Form != (FORM *)0x0) {
    pbVar20 = &this->SearchString;
    local_c0 = (string *)&this->OldSearchString;
    local_c8 = &this->Errors;
    local_d0 = &this->HelpMessage;
    uVar21 = 0;
    local_118 = pbVar20;
    do {
      (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
      PrintKeys(this,0);
      if (this->SearchMode == true) {
        std::operator+(&local_138,"Search: ",pbVar20);
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,local_138._M_dataplus._M_p);
        PrintKeys(this,1);
        move(uVar21 - 5);
        if (_stdscr == 0) {
          iVar17 = -1;
        }
        else {
          iVar17 = *(short *)(_stdscr + 4) + 1;
        }
        wtouchln(_stdscr,0,iVar17,1);
        refresh();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
      }
      local_10c = wgetch(_stdscr);
      iVar17 = -1;
      uVar21 = 0xffffffff;
      if (_stdscr != 0) {
        uVar21 = (int)*(short *)(_stdscr + 4) + 1;
        iVar17 = *(short *)(_stdscr + 6) + 1;
      }
      if ((iVar17 < 0x41) || ((int)uVar21 < 6)) {
        bVar22 = local_10c == 0x71;
        goto LAB_001407d4;
      }
      pFVar7 = current_field((this->super_cmCursesForm).Form);
      plVar8 = (long *)field_userptr(pFVar7);
      pbVar20 = local_118;
      if (this->SearchMode == true) {
        if ((local_10c == 0x157) || (local_10c == 10)) {
          this->SearchMode = false;
          if ((this->SearchString)._M_string_length != 0) {
            JumpToCacheEntry(this,(this->SearchString)._M_dataplus._M_p);
            std::__cxx11::string::_M_assign(local_c0);
          }
          bVar5 = 0;
          std::__cxx11::string::_M_replace
                    ((ulong)pbVar20,0,(char *)(this->SearchString)._M_string_length,0x4b94e2);
        }
        else {
          if (((local_10c & 0xffffffdf) - 0x41 < 0x1a) ||
             (local_10c == 0x5f || local_10c - 0x30 < 10)) {
            if ((this->SearchString)._M_string_length < (ulong)(iVar17 - 10)) {
              std::__cxx11::string::push_back((char)local_118);
            }
          }
          else if ((((local_10c == 8) || (local_10c == 0x14a)) || (local_10c == 0x107)) &&
                  (sVar1 = (this->SearchString)._M_string_length, sVar1 != 0)) {
            bVar5 = 0;
            std::__cxx11::string::resize((ulong)local_118,(char)sVar1 + -1);
            goto LAB_001401d2;
          }
LAB_001401d0:
          bVar5 = 0;
        }
      }
      else {
        if (plVar8 == (long *)0x0) goto LAB_001401d0;
        bVar5 = (**(code **)(*plVar8 + 0x10))(plVar8,&local_10c,this,_stdscr);
        if (bVar5 != 0) {
          this->OkToGenerate = false;
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])(this);
          PrintKeys(this,0);
        }
      }
LAB_001401d2:
      if (((plVar8 != (long *)0x0 & bVar5) != 0) || (this->SearchMode != false))
      goto switchD_00140247_caseD_65;
      sprintf(local_b8,"Main form handling input, key: %d",(ulong)local_10c);
      cmCursesForm::LogMessage(local_b8);
      if ((int)local_10c < 99) {
        if ((int)local_10c < 0x10) {
          if (local_10c == 4) {
LAB_001403c4:
            pFVar19 = (this->super_cmCursesForm).Form;
            iVar17 = 0x200;
LAB_001403ed:
            form_driver(pFVar19,iVar17);
          }
          else if (local_10c == 0xe) goto switchD_00140247_caseD_6a;
        }
        else {
          if (local_10c == 0x10) goto switchD_00140247_caseD_6b;
          if (local_10c == 0x15) {
LAB_001403b9:
            pFVar19 = (this->super_cmCursesForm).Form;
            iVar17 = 0x201;
            goto LAB_001403ed;
          }
          if (local_10c == 0x2f) {
            this->SearchMode = true;
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
            PrintKeys(this,1);
            if (_stdscr == 0) {
              iVar17 = -1;
            }
            else {
              iVar17 = *(short *)(_stdscr + 4) + 1;
            }
            wtouchln(_stdscr,0,iVar17,1);
            refresh();
          }
        }
        goto switchD_00140247_caseD_65;
      }
      if (0x101 < (int)local_10c) {
        if ((int)local_10c < 0x152) {
          if (local_10c == 0x102) goto switchD_00140247_caseD_6a;
          if (local_10c == 0x103) goto switchD_00140247_caseD_6b;
        }
        else {
          if (local_10c == 0x152) goto LAB_001403c4;
          if (local_10c == 0x153) goto LAB_001403b9;
        }
        goto switchD_00140247_caseD_65;
      }
      bVar22 = true;
      switch(local_10c) {
      case 99:
        Configure(this,0);
        break;
      case 100:
        if (this->NumberOfVisibleEntries != 0) {
          this->OkToGenerate = false;
          pFVar7 = current_field((this->super_cmCursesForm).Form);
          iVar17 = field_index(pFVar7);
          lVar11 = (long)iVar17;
          if (iVar17 == 2) {
            pFVar7 = (FIELD *)0x0;
          }
          else {
            ppFVar16 = this->Fields + -5;
            if (this->NumberOfVisibleEntries * 3 + -1 != lVar11) {
              ppFVar16 = this->Fields + 1;
            }
            pFVar7 = ppFVar16[lVar11];
          }
          plVar8 = (long *)field_userptr(this->Fields[lVar11 + -2]);
          if (plVar8 != (long *)0x0) {
            pcVar2 = this->CMakeInstance->State;
            pcVar10 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_138,pcVar10,(allocator<char> *)&local_f8);
            cmState::RemoveCacheEntry(pcVar2,&local_138);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                       local_138.field_2._M_local_buf[0]) + 1);
            }
            local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
            local_138._M_string_length = 0;
            local_138.field_2._M_local_buf[0] = '\0';
            if (pFVar7 != (FIELD *)0x0) {
              plVar14 = (long *)field_userptr(pFVar7);
              pcVar10 = (char *)(**(code **)(*plVar14 + 0x28))(plVar14);
              std::__cxx11::string::operator=((string *)&local_138,pcVar10);
            }
            uVar18 = 0xffffffff;
            uVar21 = 0xffffffff;
            if (_stdscr != 0) {
              uVar21 = (int)*(short *)(_stdscr + 4) + 1;
              uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
            }
            pcVar10 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
            RemoveEntry(this,pcVar10);
            RePost(this);
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar18,(ulong)uVar21);
            if ((pFVar7 != (FIELD *)0x0) &&
               (__last._M_current =
                     (this->Entries->
                     super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish,
               _Var15 = std::
                        find_if<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite**,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>,cmCursesMainForm::HandleInput()::__0>
                                  ((__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                    )(this->Entries->
                                     super__Vector_base<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start,__last,&local_138),
               _Var15._M_current != __last._M_current)) {
              set_current_field((this->super_cmCursesForm).Form,(*_Var15._M_current)->Entry->Field);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_138._M_dataplus._M_p != &local_138.field_2) {
              operator_delete(local_138._M_dataplus._M_p,
                              CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                       local_138.field_2._M_local_buf[0]) + 1);
            }
          }
        }
        break;
      case 0x67:
        if (this->OkToGenerate != true) break;
        Generate(this);
        goto switchD_00140247_caseD_71;
      case 0x68:
        local_104 = 0xffffffff;
        uVar21 = 0xffffffff;
        if (_stdscr != 0) {
          uVar21 = (int)*(short *)(_stdscr + 4) + 1;
          local_104 = (int)*(short *)(_stdscr + 6) + 1;
        }
        local_d8 = current_field((this->super_cmCursesForm).Form);
        iVar17 = field_index(local_d8);
        plVar8 = (long *)field_userptr(this->Fields[(long)iVar17 + -2]);
        local_100 = (char *)(**(code **)(*plVar8 + 0x28))(plVar8);
        pcVar2 = this->CMakeInstance->State;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_138,local_100,(allocator<char> *)&local_f8);
        pcVar10 = cmState::GetCacheEntryValue(pcVar2,&local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,
                          CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                   local_138.field_2._M_local_buf[0]) + 1);
        }
        if (pcVar10 == (char *)0x0) {
          pcVar10 = (char *)0x0;
        }
        else {
          pcVar2 = this->CMakeInstance->State;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,local_100,&local_105);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"HELPSTRING","");
          pcVar10 = cmState::GetCacheEntryProperty(pcVar2,&local_138,&local_f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_138._M_dataplus._M_p != &local_138.field_2) {
            operator_delete(local_138._M_dataplus._M_p,
                            CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                                     local_138.field_2._M_local_buf[0]) + 1);
          }
        }
        pcVar4 = local_100;
        if (pcVar10 == (char *)0x0) {
          std::__cxx11::string::operator=
                    ((string *)
                     ((this->HelpMessage).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1),"");
        }
        else {
          sVar12 = strlen(local_100);
          sVar13 = strlen(pcVar10);
          __s = (char *)operator_new__(sVar13 + sVar12 + 0x40);
          sprintf(__s,"Current option is: %s\nHelp string for this option is: %s\n",pcVar4,pcVar10);
          std::__cxx11::string::operator=
                    ((string *)
                     ((this->HelpMessage).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + 1),__s);
          operator_delete__(__s);
        }
        pcVar9 = (cmCursesLongMessageForm *)operator_new(0x60);
        cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar9,local_d0,"Help.");
        uVar3 = local_104;
        cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])
                  (pcVar9,1,1,(ulong)local_104,(ulong)uVar21);
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
        cmCursesForm::CurrentForm = &this->super_cmCursesForm;
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar3,(ulong)uVar21);
        set_current_field((this->super_cmCursesForm).Form,local_d8);
        break;
      case 0x6a:
switchD_00140247_caseD_6a:
        pFVar7 = current_field((this->super_cmCursesForm).Form);
        iVar17 = field_index(pFVar7);
        if (this->NumberOfVisibleEntries * 3 + -1 != (long)iVar17) {
          _Var6 = new_page(this->Fields[(long)iVar17 + 1]);
          pFVar19 = (this->super_cmCursesForm).Form;
          iVar17 = (uint)!_Var6 * 4 + 0x200;
          goto LAB_001403ed;
        }
LAB_001403a0:
        bVar22 = false;
        goto switchD_00140247_caseD_71;
      case 0x6b:
switchD_00140247_caseD_6b:
        pFVar7 = current_field((this->super_cmCursesForm).Form);
        iVar17 = field_index(pFVar7);
        if (iVar17 == 2) goto LAB_001403a0;
        _Var6 = new_page(this->Fields[(long)iVar17 + -2]);
        pFVar19 = (this->super_cmCursesForm).Form;
        if (_Var6) {
          form_driver(pFVar19,0x201);
          set_current_field((this->super_cmCursesForm).Form,this->Fields[(long)iVar17 + -3]);
        }
        else {
          form_driver(pFVar19,0x205);
        }
        if (iVar17 != 2) break;
        bVar22 = false;
        goto switchD_00140247_caseD_71;
      case 0x6c:
        uVar18 = 0xffffffff;
        uVar21 = 0xffffffff;
        if (_stdscr != 0) {
          uVar21 = (int)*(short *)(_stdscr + 4) + 1;
          uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        pcVar9 = (cmCursesLongMessageForm *)operator_new(0x60);
        cmCursesLongMessageForm::cmCursesLongMessageForm
                  (pcVar9,local_c8,"Errors occurred during the last pass.");
        cmCursesForm::CurrentForm = (cmCursesForm *)pcVar9;
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[3])(pcVar9,1,1,uVar18,(ulong)uVar21);
        (*(pcVar9->super_cmCursesForm)._vptr_cmCursesForm[2])(pcVar9);
        cmCursesForm::CurrentForm = &this->super_cmCursesForm;
        goto LAB_001404a7;
      case 0x6e:
        if ((this->OldSearchString)._M_string_length != 0) {
          JumpToCacheEntry(this,(this->OldSearchString)._M_dataplus._M_p);
        }
        break;
      case 0x71:
        goto switchD_00140247_caseD_71;
      case 0x74:
        this->AdvancedMode = (bool)(this->AdvancedMode ^ 1);
        uVar18 = 0xffffffff;
        uVar21 = 0xffffffff;
        if (_stdscr != 0) {
          uVar21 = (int)*(short *)(_stdscr + 4) + 1;
          uVar18 = (ulong)((int)*(short *)(_stdscr + 6) + 1);
        }
        RePost(this);
LAB_001404a7:
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,uVar18,(ulong)uVar21);
      }
switchD_00140247_caseD_65:
      if (_stdscr == 0) {
        iVar17 = -1;
      }
      else {
        iVar17 = *(short *)(_stdscr + 4) + 1;
      }
      bVar22 = false;
      wtouchln(_stdscr,0,iVar17,1);
      wrefresh(_stdscr);
switchD_00140247_caseD_71:
      pbVar20 = local_118;
LAB_001407d4:
    } while (!bVar22);
  }
  return;
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0, y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr.c_str());
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString = "";
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.resize(this->SearchString.size() - 1);
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        const char* helpString = nullptr;

        const char* existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          char* message = new char
            [strlen(curField) + strlen(helpString) +
             strlen(
               "Current option is: \n Help string for this option is: \n") +
             10];
          sprintf(
            message,
            "Current option is: %s\nHelp string for this option is: %s\n",
            curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs =
          new cmCursesLongMessageForm(this->HelpMessage, "Help.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Errors, "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        if (this->AdvancedMode) {
          this->AdvancedMode = false;
        } else {
          this->AdvancedMode = true;
        }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt =
              std::find_if(this->Entries->begin(), this->Entries->end(),
                           [&nextVal](cmCursesCacheEntryComposite* entry) {
                             return nextVal == entry->Key;
                           });

            if (nextEntryIt != this->Entries->end()) {
              set_current_field(this->Form, (*nextEntryIt)->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}